

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2Text(xmlParserCtxtPtr ctxt,xmlChar *ch,int len,xmlElementType type)

{
  _xmlNode *p_Var1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlNodePtr node;
  long lVar5;
  bool bVar6;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return;
  }
  if (ctxt->node == (xmlNodePtr)0x0) {
    return;
  }
  node = ctxt->node->last;
  if (node == (xmlNodePtr)0x0) {
    if (type == XML_TEXT_NODE) {
      node = xmlSAX2TextNode(ctxt,ch,len);
    }
    else {
      node = xmlNewCDataBlock(ctxt->myDoc,ch,len);
    }
    if (node == (xmlNodePtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      return;
    }
    p_Var1 = ctxt->node;
    p_Var1->children = node;
    p_Var1->last = node;
    node->parent = p_Var1;
    node->doc = p_Var1->doc;
    ctxt->nodelen = len;
    ctxt->nodemem = len + 1;
    goto LAB_001493c6;
  }
  if (node->type == type) {
    if ((type == XML_TEXT_NODE) || (bVar6 = true, ctxt->html == 0)) {
      bVar6 = node->name == "text";
    }
  }
  else {
    bVar6 = false;
  }
  if (bVar6) {
    if (ctxt->nodemem == 0) {
      if (!bVar6) goto LAB_001492ed;
      iVar3 = xmlTextConcat(node,ch,len);
      if (iVar3 != 0) {
        xmlCtxtErrMemory(ctxt);
      }
      bVar6 = true;
      if (ctxt->node->children != (_xmlNode *)0x0) {
        iVar3 = xmlStrlen(node->content);
        ctxt->nodelen = iVar3;
        ctxt->nodemem = iVar3 + 1;
      }
    }
    else {
      iVar3 = 1000000000;
      if ((ctxt->options & 0x80000) == 0) {
        iVar3 = 10000000;
      }
      pxVar4 = node->content;
      if ((_xmlAttr **)pxVar4 == &node->properties) {
        pxVar4 = xmlStrdup(pxVar4);
        node->content = pxVar4;
        node->properties = (_xmlAttr *)0x0;
      }
      else if ((ctxt->nodemem == ctxt->nodelen + 1) &&
              (iVar2 = xmlDictOwns(ctxt->dict,pxVar4), iVar2 != 0)) {
        pxVar4 = xmlStrdup(node->content);
        node->content = pxVar4;
      }
      if (node->content == (xmlChar *)0x0) {
        xmlCtxtErrMemory(ctxt);
      }
      else {
        if ((len <= iVar3) && (ctxt->nodelen <= iVar3 - len)) {
          iVar3 = ctxt->nodemem;
          if (iVar3 <= ctxt->nodelen + len) {
            iVar2 = iVar3 + len;
            if ((int)(len ^ 0x7fffffffU) < iVar3) {
              iVar2 = 0x7fffffff;
            }
            iVar3 = iVar2 * 2;
            if (0x3fffffff < iVar2) {
              iVar3 = 0x7fffffff;
            }
            pxVar4 = (xmlChar *)(*xmlRealloc)(node->content,(long)iVar3);
            if (pxVar4 == (xmlChar *)0x0) {
              xmlCtxtErrMemory(ctxt);
              goto LAB_0014937d;
            }
            ctxt->nodemem = iVar3;
            node->content = pxVar4;
          }
          memcpy(node->content + ctxt->nodelen,ch,(long)len);
          lVar5 = (long)ctxt->nodelen + (long)len;
          ctxt->nodelen = (int)lVar5;
          node->content[lVar5] = '\0';
          bVar6 = true;
          goto LAB_001493c1;
        }
        xmlFatalErr(ctxt,XML_ERR_RESOURCE_LIMIT,"Text node too long, try XML_PARSE_HUGE");
        xmlHaltParser(ctxt);
      }
LAB_0014937d:
      bVar6 = false;
    }
  }
  else {
LAB_001492ed:
    if (type == XML_TEXT_NODE) {
      node = xmlSAX2TextNode(ctxt,ch,len);
      if (node == (xmlNodePtr)0x0) {
        node = (xmlNodePtr)0x0;
      }
      else {
        node->doc = ctxt->myDoc;
      }
    }
    else {
      node = xmlNewCDataBlock(ctxt->myDoc,ch,len);
    }
    if (node == (xmlNodePtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      bVar6 = true;
      node = (xmlNodePtr)0x0;
    }
    else {
      xmlSAX2AppendChild(ctxt,node);
      bVar6 = true;
      if (ctxt->node->children != (_xmlNode *)0x0) {
        ctxt->nodelen = len;
        ctxt->nodemem = len + 1;
      }
    }
  }
LAB_001493c1:
  if (!bVar6) {
    return;
  }
LAB_001493c6:
  if ((((type == XML_TEXT_NODE) && (node != (xmlNodePtr)0x0)) && (ctxt->linenumbers != 0)) &&
     (ctxt->input != (xmlParserInputPtr)0x0)) {
    iVar3 = ctxt->input->line;
    if ((void *)(long)iVar3 < (void *)0xffff) {
      node->line = (unsigned_short)iVar3;
    }
    else {
      node->line = 0xffff;
      if ((ctxt->options & 0x400000) != 0) {
        node->psvi = (void *)(long)iVar3;
      }
    }
  }
  return;
}

Assistant:

static void
xmlSAX2Text(xmlParserCtxtPtr ctxt, const xmlChar *ch, int len,
            xmlElementType type)
{
    xmlNodePtr lastChild;

    if (ctxt == NULL) return;
    /*
     * Handle the data if any. If there is no child
     * add it as content, otherwise if the last child is text,
     * concatenate it, else create a new node of type text.
     */

    if (ctxt->node == NULL) {
        return;
    }
    lastChild = ctxt->node->last;

    /*
     * Here we needed an accelerator mechanism in case of very large
     * elements. Use an attribute in the structure !!!
     */
    if (lastChild == NULL) {
        if (type == XML_TEXT_NODE)
            lastChild = xmlSAX2TextNode(ctxt, ch, len);
        else
            lastChild = xmlNewCDataBlock(ctxt->myDoc, ch, len);
	if (lastChild != NULL) {
	    ctxt->node->children = lastChild;
	    ctxt->node->last = lastChild;
	    lastChild->parent = ctxt->node;
	    lastChild->doc = ctxt->node->doc;
	    ctxt->nodelen = len;
	    ctxt->nodemem = len + 1;
	} else {
	    xmlSAX2ErrMemory(ctxt);
	    return;
	}
    } else {
	int coalesceText = (lastChild != NULL) &&
	    (lastChild->type == type) &&
	    (((ctxt->html) && (type != XML_TEXT_NODE)) ||
             (lastChild->name == xmlStringText));
	if ((coalesceText) && (ctxt->nodemem != 0)) {
            int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                            XML_MAX_HUGE_LENGTH :
                            XML_MAX_TEXT_LENGTH;

	    /*
	     * The whole point of maintaining nodelen and nodemem,
	     * xmlTextConcat is too costly, i.e. compute length,
	     * reallocate a new buffer, move data, append ch. Here
	     * We try to minimize realloc() uses and avoid copying
	     * and recomputing length over and over.
	     */
	    if (lastChild->content == (xmlChar *)&(lastChild->properties)) {
		lastChild->content = xmlStrdup(lastChild->content);
		lastChild->properties = NULL;
	    } else if ((ctxt->nodemem == ctxt->nodelen + 1) &&
	               (xmlDictOwns(ctxt->dict, lastChild->content))) {
		lastChild->content = xmlStrdup(lastChild->content);
	    }
	    if (lastChild->content == NULL) {
		xmlSAX2ErrMemory(ctxt);
		return;
 	    }
            if ((len > maxLength) || (ctxt->nodelen > maxLength - len)) {
                xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT,
                            "Text node too long, try XML_PARSE_HUGE");
                xmlHaltParser(ctxt);
                return;
            }
	    if (ctxt->nodelen + len >= ctxt->nodemem) {
		xmlChar *newbuf;
		int size;

		size = ctxt->nodemem > INT_MAX - len ?
                       INT_MAX :
                       ctxt->nodemem + len;
		size = size > INT_MAX / 2 ? INT_MAX : size * 2;
                newbuf = (xmlChar *) xmlRealloc(lastChild->content,size);
		if (newbuf == NULL) {
		    xmlSAX2ErrMemory(ctxt);
		    return;
		}
		ctxt->nodemem = size;
		lastChild->content = newbuf;
	    }
	    memcpy(&lastChild->content[ctxt->nodelen], ch, len);
	    ctxt->nodelen += len;
	    lastChild->content[ctxt->nodelen] = 0;
	} else if (coalesceText) {
	    if (xmlTextConcat(lastChild, ch, len)) {
		xmlSAX2ErrMemory(ctxt);
	    }
	    if (ctxt->node->children != NULL) {
		ctxt->nodelen = xmlStrlen(lastChild->content);
		ctxt->nodemem = ctxt->nodelen + 1;
	    }
	} else {
	    /* Mixed content, first time */
            if (type == XML_TEXT_NODE) {
                lastChild = xmlSAX2TextNode(ctxt, ch, len);
                if (lastChild != NULL)
                    lastChild->doc = ctxt->myDoc;
            } else
                lastChild = xmlNewCDataBlock(ctxt->myDoc, ch, len);
	    if (lastChild == NULL) {
                xmlSAX2ErrMemory(ctxt);
            } else {
		xmlSAX2AppendChild(ctxt, lastChild);
		if (ctxt->node->children != NULL) {
		    ctxt->nodelen = len;
		    ctxt->nodemem = len + 1;
		}
	    }
	}
    }

    if ((lastChild != NULL) &&
        (type == XML_TEXT_NODE) &&
        (ctxt->linenumbers) &&
        (ctxt->input != NULL)) {
        if ((unsigned) ctxt->input->line < (unsigned) USHRT_MAX)
            lastChild->line = ctxt->input->line;
        else {
            lastChild->line = USHRT_MAX;
            if (ctxt->options & XML_PARSE_BIG_LINES)
                lastChild->psvi = XML_INT_TO_PTR(ctxt->input->line);
        }
    }
}